

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O0

bool crnlib::create_compressed_texture
               (crn_comp_params *params,crn_mipmap_params *mipmap_params,
               vector<unsigned_char> *comp_data,uint32 *pActual_quality_level,float *pActual_bitrate
               )

{
  bool bVar1;
  uint uVar2;
  mip_level *this;
  image_u8 *this_00;
  color_quad<unsigned_char,_int> *pcVar3;
  undefined4 *in_RCX;
  void *in_RDI;
  undefined4 *in_R8;
  uint l;
  uint f;
  crn_comp_params new_params;
  mipmapped_texture work_tex;
  mipmapped_texture *in_stack_00000e80;
  crn_comp_params *in_stack_00000e88;
  uint in_stack_fffffffffffffba8;
  uint in_stack_fffffffffffffbac;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  undefined8 in_stack_fffffffffffffbb8;
  vector<unsigned_char> *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbd0;
  uint uVar4;
  undefined4 in_stack_fffffffffffffbd4;
  uint local_408;
  uint local_404;
  undefined1 local_400 [20];
  uint local_3ec;
  undefined8 auStack_3d8 [9];
  undefined1 in_stack_fffffffffffffc87;
  crn_mipmap_params *in_stack_fffffffffffffc88;
  crn_comp_params *in_stack_fffffffffffffc90;
  mipmapped_texture *in_stack_fffffffffffffc98;
  bool local_1;
  
  vector<unsigned_char>::resize
            (in_stack_fffffffffffffbc0,(uint)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x18,0));
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  mipmapped_texture::mipmapped_texture
            ((mipmapped_texture *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  bVar1 = create_dds_tex(in_stack_00000e88,in_stack_00000e80);
  if (bVar1) {
    bVar1 = create_texture_mipmaps
                      (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88
                       ,(bool)in_stack_fffffffffffffc87);
    if (bVar1) {
      memcpy(local_400,in_RDI,0x378);
      local_3ec = mipmapped_texture::get_num_levels
                            ((mipmapped_texture *)
                             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      memset(auStack_3d8,0,0x300);
      local_404 = 0;
      while( true ) {
        uVar2 = mipmapped_texture::get_num_faces((mipmapped_texture *)0x1bc653);
        if (uVar2 <= local_404) break;
        local_408 = 0;
        while( true ) {
          uVar4 = local_408;
          uVar2 = mipmapped_texture::get_num_levels
                            ((mipmapped_texture *)
                             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          if (uVar2 <= uVar4) break;
          this = mipmapped_texture::get_level
                           ((mipmapped_texture *)
                            CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                            in_stack_fffffffffffffbac,in_stack_fffffffffffffba8);
          this_00 = mip_level::get_image(this);
          pcVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(this_00);
          auStack_3d8[(ulong)local_404 * 0x10 + (ulong)local_408] = pcVar3;
          local_408 = local_408 + 1;
        }
        local_404 = local_404 + 1;
      }
      in_stack_fffffffffffffbb7 =
           create_compressed_texture
                     ((crn_comp_params *)new_params._848_8_,
                      (vector<unsigned_char> *)new_params._840_8_,(uint32 *)new_params._832_8_,
                      (float *)new_params._824_8_);
      local_1 = (bool)in_stack_fffffffffffffbb7;
    }
    else {
      local_1 = false;
    }
  }
  else {
    console::error("Failed creating DDS texture from crn_comp_params!");
    local_1 = false;
  }
  mipmapped_texture::~mipmapped_texture
            ((mipmapped_texture *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
  return local_1;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, const crn_mipmap_params& mipmap_params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate) {
  comp_data.resize(0);
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;
  if (pActual_quality_level)
    *pActual_quality_level = 0;

  mipmapped_texture work_tex;
  if (!create_dds_tex(params, work_tex)) {
    console::error("Failed creating DDS texture from crn_comp_params!");
    return false;
  }

  if (!create_texture_mipmaps(work_tex, params, mipmap_params, true))
    return false;

  crn_comp_params new_params(params);
  new_params.m_levels = work_tex.get_num_levels();
  memset(new_params.m_pImages, 0, sizeof(new_params.m_pImages));

  for (uint f = 0; f < work_tex.get_num_faces(); f++)
    for (uint l = 0; l < work_tex.get_num_levels(); l++)
      new_params.m_pImages[f][l] = (uint32*)work_tex.get_level(f, l)->get_image()->get_ptr();

  return create_compressed_texture(new_params, comp_data, pActual_quality_level, pActual_bitrate);
}